

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

size_t __thiscall rcg::Stream::getBufAnnounceMin(Stream *this)

{
  recursive_mutex *__mutex;
  size_t sVar1;
  int iVar2;
  undefined8 uVar3;
  unsigned_long ret;
  size_t size;
  INFO_DATATYPE type;
  size_t local_28 [2];
  INFO_DATATYPE local_14;
  
  __mutex = &this->mtx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    local_28[0] = 0;
    local_28[1] = 8;
    if (this->stream != (DS_HANDLE)0x0) {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSGetInfo)(this->stream,0xc,&local_14,local_28,local_28 + 1);
    }
    sVar1 = local_28[0];
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return sVar1;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

size_t Stream::getBufAnnounceMin()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  return getStreamValue<size_t>(gentl, stream, GenTL::STREAM_INFO_BUF_ANNOUNCE_MIN);
}